

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

OSObject * __thiscall OSToken::createObject(OSToken *this)

{
  int inUmask;
  ObjectFile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string lockPath;
  MutexLocker lock;
  string objectPath;
  string objectUUID;
  string local_58;
  string local_38;
  
  if (this->valid == true) {
    UUID::newUUID_abi_cxx11_();
    std::operator+(&local_f8,&this->tokenPath,"/");
    std::operator+(&lockPath,&local_f8,&objectUUID);
    std::operator+(&objectPath,&lockPath,".object");
    std::__cxx11::string::~string((string *)&lockPath);
    std::__cxx11::string::~string((string *)&local_f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock,
                   &this->tokenPath,"/");
    std::operator+(&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock,
                   &objectUUID);
    std::operator+(&lockPath,&local_f8,".lock");
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&lock);
    this_00 = (ObjectFile *)operator_new(0xb0);
    std::__cxx11::string::string((string *)&local_38,(string *)&objectPath);
    inUmask = this->umask;
    std::__cxx11::string::string((string *)&local_58,(string *)&lockPath);
    ObjectFile::ObjectFile(this_00,this,&local_38,inUmask,&local_58,true);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    if (this_00->valid == false) {
      softHSMLog(3,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x165,"Failed to create new object %s",objectPath._M_dataplus._M_p);
      (*(this_00->super_OSObject)._vptr_OSObject[1])(this_00);
      this_00 = (ObjectFile *)0x0;
    }
    else {
      MutexLocker::MutexLocker(&lock,this->tokenMutex);
      local_f8._M_dataplus._M_p = (pointer)this_00;
      std::
      _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
      ::_M_insert_unique<OSObject*>
                ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                  *)&this->objects,(OSObject **)&local_f8);
      local_f8._M_dataplus._M_p = (pointer)this_00;
      std::
      _Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
      ::_M_insert_unique<OSObject*>
                ((_Rb_tree<OSObject*,OSObject*,std::_Identity<OSObject*>,std::less<OSObject*>,std::allocator<OSObject*>>
                  *)&this->allObjects,(OSObject **)&local_f8);
      ObjectFile::getFilename_abi_cxx11_(&local_f8,this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->currentFiles,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      softHSMLog(7,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x173,"(0x%08X) Created new object %s (0x%08X)",this,objectPath._M_dataplus._M_p,
                 this_00);
      Generation::update(this->gen);
      Generation::commit(this->gen);
      MutexLocker::~MutexLocker(&lock);
    }
    std::__cxx11::string::~string((string *)&lockPath);
    std::__cxx11::string::~string((string *)&objectPath);
    std::__cxx11::string::~string((string *)&objectUUID);
  }
  else {
    this_00 = (ObjectFile *)0x0;
  }
  return &this_00->super_OSObject;
}

Assistant:

OSObject* OSToken::createObject()
{
	if (!valid) return NULL;

	// Generate a name for the object
	std::string objectUUID = UUID::newUUID();
	std::string objectPath = tokenPath + OS_PATHSEP + objectUUID + ".object";
	std::string lockPath = tokenPath + OS_PATHSEP + objectUUID + ".lock";

	// Create the new object file
	ObjectFile* newObject = new ObjectFile(this, objectPath, umask, lockPath, true);

	if (!newObject->valid)
	{
		ERROR_MSG("Failed to create new object %s", objectPath.c_str());

		delete newObject;

		return NULL;
	}

	// Now add it to the set of objects
	MutexLocker lock(tokenMutex);

	objects.insert(newObject);
	allObjects.insert(newObject);
	currentFiles.insert(newObject->getFilename());

	DEBUG_MSG("(0x%08X) Created new object %s (0x%08X)", this, objectPath.c_str(), newObject);

	gen->update();

	gen->commit();

	return newObject;
}